

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O1

void __thiscall sim_value_scalar_Test::TestBody(sim_value_scalar_Test *this)

{
  size_type *psVar1;
  __buckets_ptr this_00;
  int iVar2;
  Generator *this_01;
  Var *var;
  Var *var_00;
  Var *var_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *message;
  char *in_R9;
  pointer *__ptr;
  optional<unsigned_long> oVar3;
  undefined1 local_378 [8];
  Context context;
  Simulator sim;
  shared_ptr<kratos::Stmt> local_a0;
  shared_ptr<kratos::Stmt> local_90;
  _Storage<unsigned_long,_true> local_80;
  optional<unsigned_long> res;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  Message local_48;
  AssertionResult gtest_ar_;
  
  local_378 = (undefined1  [8])&context.modules_._M_h._M_rehash_policy._M_next_resize;
  context.modules_._M_h._M_buckets = (__buckets_ptr)0x1;
  context.modules_._M_h._M_bucket_count = 0;
  context.modules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  context.modules_._M_h._M_element_count._0_4_ = 0x3f800000;
  context.modules_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  context.modules_._M_h._M_rehash_policy._4_4_ = 0;
  context.modules_._M_h._M_rehash_policy._M_next_resize = 0;
  context.modules_._M_h._M_single_bucket =
       (__node_base_ptr)&context.generator_hash_._M_h._M_rehash_policy._M_next_resize;
  context.generator_hash_._M_h._M_buckets = (__buckets_ptr)0x1;
  context.generator_hash_._M_h._M_bucket_count = 0;
  context.generator_hash_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  context.generator_hash_._M_h._M_element_count._0_4_ = 0x3f800000;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&context.enum_defs_;
  context.enum_defs_._M_t._M_impl._0_4_ = 0;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  context.generator_hash_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  context.generator_hash_._M_h._M_rehash_policy._4_4_ = 0;
  context.generator_hash_._M_h._M_rehash_policy._M_next_resize = 0;
  context.generator_hash_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&context.empty_generators_._M_h._M_rehash_policy._M_next_resize;
  context.empty_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  context.empty_generators_._M_h._M_bucket_count = 0;
  context.empty_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  context.empty_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  context._224_8_ = &context.tracked_generators_._M_h._M_rehash_policy._M_next_resize;
  context.empty_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  context.empty_generators_._M_h._M_rehash_policy._4_4_ = 0;
  context.empty_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  context.empty_generators_._M_h._M_single_bucket._0_1_ = 0;
  context.tracked_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  context.tracked_generators_._M_h._M_bucket_count = 0;
  context.tracked_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  context.tracked_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  context.tracked_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  context.tracked_generators_._M_h._M_rehash_policy._4_4_ = 0;
  context.tracked_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  psVar1 = &sim.values_._M_h._M_bucket_count;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"mod","");
  this_01 = kratos::Context::generator
                      ((Context *)local_378,
                       (string *)&context.tracked_generators_._M_h._M_single_bucket);
  if (context.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)psVar1) {
    operator_delete(context.tracked_generators_._M_h._M_single_bucket,
                    sim.values_._M_h._M_bucket_count + 1);
  }
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"a","");
  var = kratos::Generator::var
                  (this_01,(string *)&context.tracked_generators_._M_h._M_single_bucket,1);
  if (context.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)psVar1) {
    operator_delete(context.tracked_generators_._M_h._M_single_bucket,
                    sim.values_._M_h._M_bucket_count + 1);
  }
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"b","");
  var_00 = kratos::Generator::var
                     (this_01,(string *)&context.tracked_generators_._M_h._M_single_bucket,1);
  if (context.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)psVar1) {
    operator_delete(context.tracked_generators_._M_h._M_single_bucket,
                    sim.values_._M_h._M_bucket_count + 1);
  }
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"c","");
  var_01 = kratos::Generator::var
                     (this_01,(string *)&context.tracked_generators_._M_h._M_single_bucket,3);
  if (context.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)psVar1) {
    operator_delete(context.tracked_generators_._M_h._M_single_bucket,
                    sim.values_._M_h._M_bucket_count + 1);
  }
  iVar2 = (*(var_01->super_IRNode)._vptr_IRNode[9])(var_01,0);
  kratos::Const::constant(0,1,false);
  kratos::Var::assign((Var *)&context.tracked_generators_._M_h._M_single_bucket,
                      (Var *)CONCAT44(extraout_var,iVar2));
  this_00 = sim.values_._M_h._M_buckets;
  sim.simulation_depth_ = (uint64_t)context.tracked_generators_._M_h._M_single_bucket;
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  sim.values_._M_h._M_buckets = (__buckets_ptr)0x0;
  kratos::Generator::add_stmt(this_01,(shared_ptr<kratos::Stmt> *)&sim.simulation_depth_);
  if (this_00 != (__buckets_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if (sim.values_._M_h._M_buckets != (__buckets_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sim.values_._M_h._M_buckets);
  }
  iVar2 = (*(var_01->super_IRNode)._vptr_IRNode[9])(var_01,1);
  kratos::Var::assign((Var *)&context.tracked_generators_._M_h._M_single_bucket,
                      (Var *)CONCAT44(extraout_var_00,iVar2));
  local_a0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)context.tracked_generators_._M_h._M_single_bucket;
  local_a0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sim.values_._M_h._M_buckets;
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  sim.values_._M_h._M_buckets = (__buckets_ptr)0x0;
  kratos::Generator::add_stmt(this_01,&local_a0);
  if (local_a0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (sim.values_._M_h._M_buckets != (__buckets_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sim.values_._M_h._M_buckets);
  }
  kratos::Var::assign((Var *)&context.tracked_generators_._M_h._M_single_bucket,var);
  local_90.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)context.tracked_generators_._M_h._M_single_bucket;
  local_90.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sim.values_._M_h._M_buckets;
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  sim.values_._M_h._M_buckets = (__buckets_ptr)0x0;
  kratos::Generator::add_stmt(this_01,&local_90);
  if (local_90.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (sim.values_._M_h._M_buckets != (__buckets_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sim.values_._M_h._M_buckets);
  }
  kratos::Simulator::Simulator
            ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,this_01);
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = 1;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
  kratos::Simulator::set
            ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,var_00,oVar3,true);
  oVar3 = kratos::Simulator::get
                    ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,var_01);
  local_80._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  local_48.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_48.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,
                res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_) & 0xffffff01;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (((undefined1  [16])
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged,(internal *)&local_48,
               (AssertionResult *)"res != std::nullopt","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x25,(char *)CONCAT71(res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                     super__Optional_payload_base<unsigned_long>._9_7_,
                                     res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                     super__Optional_payload_base<unsigned_long>._M_engaged));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT71(res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._9_7_,
                    res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._M_engaged) != &gtest_ar.message_) {
      operator_delete((undefined1 *)
                      CONCAT71(res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                               super__Optional_payload_base<unsigned_long>._9_7_,
                               res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                               super__Optional_payload_base<unsigned_long>._M_engaged),
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  local_48.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)
             &res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,"*res","2",&local_80._M_value,
             (int *)&local_48);
  if (res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == false) {
    testing::Message::Message(&local_48);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x26,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if ((long *)CONCAT44(local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_48.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_48.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  std::
  _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&sim.scope_._M_h._M_single_bucket);
  std::
  _Hashtable<kratos::Stmt_*,_kratos::Stmt_*,_std::allocator<kratos::Stmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Stmt_*,_kratos::Stmt_*,_std::allocator<kratos::Stmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&sim.linked_dependency_._M_h._M_single_bucket);
  std::
  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&sim.dependency_._M_h._M_single_bucket);
  std::
  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&sim.event_queue_.c.
                    super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  _Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
  ::~_Deque_base((_Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
                  *)&sim.complex_values_._M_h._M_single_bucket);
  std::
  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&sim.values_._M_h._M_single_bucket);
  std::
  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&context.tracked_generators_._M_h._M_single_bucket);
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&context.track_generated_);
  std::
  _Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
               *)&context.max_instance_id_);
  std::
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&context.modules_._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_378);
  return;
}

Assistant:

TEST(sim, value_scalar) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 1);
    auto &b = mod.var("b", 1);
    auto &c = mod.var("c", 3);
    mod.add_stmt(c[0].assign(constant(0, 1)));
    mod.add_stmt(c[1].assign(b));
    mod.add_stmt(a.assign(b));

    Simulator sim(&mod);
    sim.set(&b, 1);

    auto res = sim.get(&c);
    EXPECT_TRUE(res != std::nullopt);
    EXPECT_EQ(*res, 2);
}